

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkSIprefix(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char p;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  precise_unit pVar9;
  precise_unit pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  double local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  double local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (2 < unit_string->_M_string_length) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    cVar1 = pcVar2[1];
    if (cVar1 == 'A') {
      bVar6 = true;
      goto LAB_004095bb;
    }
    local_d0 = getPrefixMultiplier2Char(*pcVar2,cVar1);
    if ((local_d0 == 0.0) && (!NAN(local_d0))) goto LAB_004095b9;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
               0xffffffffffffffff);
    if (local_c0._M_string_length != 1) {
LAB_00409847:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      pVar9 = unit_quick_match(&local_50,match_flags);
      dVar7 = pVar9.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_98 = pVar9._8_8_;
      uVar4 = local_98 & 0xffffffff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        pVar9.base_units_ = (unit_data)(undefined4)local_98;
        pVar9.commodity_ = local_98._4_4_;
        pVar9.multiplier_ = dVar7;
      }
      local_98 = pVar9._8_8_;
      local_d0 = local_d0 * pVar9.multiplier_;
      uVar5 = local_98;
      if (uVar4 != 0xfa94a488 || !NAN(dVar7)) goto LAB_004099c0;
      bVar6 = false;
      goto LAB_004095bb;
    }
    cVar1 = *local_c0._M_dataplus._M_p;
    if (cVar1 == 'k') goto LAB_0040994b;
    uVar5 = 0x4000000;
    if (cVar1 != 'b') {
      if (cVar1 != 'B') goto LAB_00409847;
      dVar7 = local_d0 * 8.0;
      goto LAB_004099a3;
    }
LAB_004099a9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_004099c0;
  }
LAB_004095b9:
  bVar6 = false;
LAB_004095bb:
  if (1 < unit_string->_M_string_length) {
    cVar1 = *(unit_string->_M_dataplus)._M_p;
    p = 'n';
    if (cVar1 != 'N') {
      p = cVar1;
    }
    if (((uint)match_flags >> 9 & 1) == 0) {
      p = cVar1;
    }
    if (((uint)match_flags >> 8 & 1) == 0) {
      dVar7 = getPrefixMultiplier(p);
    }
    else {
      dVar7 = 0.0;
      switch(p) {
      case 'E':
        dVar7 = 1e+18;
        break;
      case 'F':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'N':
      case 'O':
      case 'S':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case '[':
      case '\\':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'b':
      case 'e':
      case 'g':
      case 'i':
      case 'j':
      case 'l':
      case 'o':
      case 's':
      case 't':
      case 'v':
      case 'w':
      case 'x':
        break;
      case 'G':
        dVar7 = 1000000000.0;
        break;
      case 'M':
        dVar7 = 1000000.0;
        break;
      case 'P':
        dVar7 = 1e+15;
        break;
      case 'Q':
        dVar7 = 1e+30;
        break;
      case 'R':
        dVar7 = 1e+27;
        break;
      case 'T':
        dVar7 = 1000000000000.0;
        break;
      case 'Y':
        dVar7 = 1e+24;
        break;
      case 'Z':
        dVar7 = 1e+21;
        break;
      case 'a':
        dVar7 = 1e-18;
        break;
      case 'c':
        dVar7 = 0.01;
        break;
      case 'd':
        dVar7 = 0.1;
        break;
      case 'f':
        dVar7 = 1e-15;
        break;
      case 'h':
        dVar7 = 100.0;
        break;
      case 'k':
        dVar7 = 1000.0;
        break;
      case 'm':
        dVar7 = 0.001;
        break;
      case 'n':
        dVar7 = 1e-09;
        break;
      case 'p':
        dVar7 = 1e-12;
        break;
      case 'q':
        dVar7 = 1e-30;
        break;
      case 'r':
        dVar7 = 1e-27;
        break;
      case 'u':
switchD_00409682_caseD_75:
        dVar7 = 1e-06;
        break;
      case 'y':
        dVar7 = 1e-24;
        break;
      case 'z':
        dVar7 = 1e-21;
        break;
      default:
        dVar7 = 0.0;
        if (p == -0x4b) goto switchD_00409682_caseD_75;
      }
    }
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
                 0xffffffffffffffff);
      if (local_c0._M_string_length == 1) {
        cVar1 = *local_c0._M_dataplus._M_p;
        if (cVar1 == 'k') {
LAB_0040994b:
          local_d0 = NAN;
          uVar5 = 0xfa94a488;
          goto LAB_004099a9;
        }
        if (cVar1 != 'b') {
          if (cVar1 != 'B') goto LAB_00409691;
          dVar7 = dVar7 * 8.0;
        }
LAB_004099a3:
        uVar5 = 0x4000000;
        local_d0 = dVar7;
        goto LAB_004099a9;
      }
LAB_00409691:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      pVar9 = unit_quick_match(&local_70,match_flags);
      local_a0 = pVar9.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pVar9._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(local_a0)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        local_d0 = dVar7 * local_a0;
        uVar5 = pVar9._8_8_;
        goto LAB_004099c0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (bVar6) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    dVar7 = getPrefixMultiplier2Char(*pcVar2,pcVar2[1]);
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
                 0xffffffffffffffff);
      iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_c0,"B");
      if (iVar3 == 0) {
        dVar7 = dVar7 * 8.0;
      }
      else {
        iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_c0,"b");
        if (iVar3 != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_c0._M_dataplus._M_p,
                     local_c0._M_dataplus._M_p + local_c0._M_string_length);
          pVar9 = unit_quick_match(&local_90,match_flags);
          dVar8 = pVar9.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            local_a0 = pVar9.multiplier_;
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            dVar8 = local_a0;
          }
          bVar6 = (pVar9._8_8_ & 0xffffffff) != 0xfa94a488;
          uVar5 = local_98;
          if (bVar6 || !NAN(dVar8)) {
            local_d0 = dVar7 * dVar8;
            uVar5 = pVar9._8_8_;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (bVar6 || !NAN(dVar8)) goto LAB_004099c0;
          goto LAB_0040982e;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      uVar5 = 0x4000000;
      local_d0 = dVar7;
      goto LAB_004099c0;
    }
  }
LAB_0040982e:
  local_d0 = NAN;
  uVar5 = 0xfa94a488;
LAB_004099c0:
  pVar10.base_units_ = (unit_data)(int)uVar5;
  pVar10.commodity_ = (int)(uVar5 >> 0x20);
  pVar10.multiplier_ = local_d0;
  return pVar10;
}

Assistant:

static precise_unit
    checkSIprefix(const std::string& unit_string, std::uint64_t match_flags)
{
    bool threeAgain{false};
    if (unit_string.size() >= 3) {
        if (unit_string[1] == 'A') {
            threeAgain = true;
        } else {
            auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
            if (mux != 0.0) {
                auto ustring = unit_string.substr(2);
                if (ustring.size() == 1) {
                    switch (ustring.front()) {
                        case 'B':
                            return {mux, precise::data::byte};
                        case 'b':
                            return {mux, precise::data::bit};
                        case 'k':
                            return precise::invalid;
                        default:
                            break;
                    }
                }

                auto retunit = unit_quick_match(ustring, match_flags);
                if (is_valid(retunit)) {
                    return {mux, retunit};
                }
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto c = unit_string.front();
        if (c == 'N' && ((match_flags & case_insensitive) != 0)) {
            c = 'n';
        }
        auto mux = ((match_flags & strict_si) == 0) ?
            getPrefixMultiplier(c) :
            getStrictSIPrefixMultiplier(c);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(1);
            if (ustring.size() == 1) {
                switch (ustring.front()) {
                    case 'B':
                        return {mux, precise::data::byte};
                    case 'b':
                        return {mux, precise::data::bit};
                    case 'k':
                        return precise::invalid;
                    default:
                        break;
                }
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return {mux, retunit};
            }
        }
    }
    if (threeAgain) {
        auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(2);
            if (ustring == "B") {
                return {mux, precise::data::byte};
            }
            if (ustring == "b") {
                return {mux, precise::data::bit};
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (is_valid(retunit)) {
                return {mux, retunit};
            }
        }
    }
    return precise::invalid;
}